

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_false,_false>::push_block_(DaTrie<false,_false,_false> *this)

{
  uint block_pos_00;
  uint uVar1;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_RDI;
  uint32_t i_1;
  uint32_t end;
  uint32_t begin;
  uint32_t i;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_stack_ffffffffffffffb0;
  DaTrie<false,_false,_false> *this_00;
  uint uVar2;
  Block local_28 [4];
  Bc local_18;
  uint local_10;
  uint32_t local_c;
  
  local_c = num_blocks((DaTrie<false,_false,_false> *)0x15b3f8);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    Bc::Bc(&local_18);
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::push_back
              (in_stack_ffffffffffffffb0,
               (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    Bc::~Bc(&local_18);
  }
  this_00 = (DaTrie<false,_false,_false> *)(in_RDI + 2);
  memset(local_28,0,4);
  Block::Block(local_28);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::push_back
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)this_00,
             (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  block_pos_00 = local_c * 0x100;
  uVar1 = block_pos_00 + 0x100;
  uVar2 = block_pos_00;
  for (; block_pos_00 < uVar1; block_pos_00 = block_pos_00 + 1) {
    set_next_(this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    set_prev_(this_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  push_block_((DaTrie<false,_false,_false> *)CONCAT44(uVar2,uVar1),block_pos_00,in_RDI);
  *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                  super__Vector_impl_data._M_start + 4) =
       *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl
                       .super__Vector_impl_data._M_start + 4) + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }